

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpipe.cpp
# Opt level: O3

int __thiscall TokenPipeEnd::TokenRead(TokenPipeEnd *this)

{
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  long in_FS_OFFSET;
  uint8_t token;
  byte local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    sVar2 = read(this->m_fd,&local_19,1);
    if (-1 < sVar2) {
      if (sVar2 == 0) {
        uVar1 = 0xfffffffe;
      }
      else {
        uVar1 = (uint)local_19;
      }
      goto LAB_00de644e;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  uVar1 = 0xffffffff;
LAB_00de644e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

int TokenPipeEnd::TokenRead()
{
    uint8_t token;
    while (true) {
        ssize_t result = read(m_fd, &token, 1);
        if (result < 0) {
            // Failure. Check if the read was interrupted by a signal,
            // in that case retry.
            if (errno != EINTR) {
                return TS_ERR;
            }
        } else if (result == 0) {
            return TS_EOS;
        } else { // ==1
            return token;
        }
    }
    return token;
}